

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall
VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_>::shrink_to_fit
          (VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_> *this)

{
  ulong uVar1;
  VkAllocationCallbacks *pVVar2;
  VkMappedMemoryRange *__dest;
  
  uVar1 = this->m_Count;
  if (uVar1 < this->m_Capacity) {
    if (uVar1 == 0) {
      __dest = (VkMappedMemoryRange *)0x0;
    }
    else {
      __dest = (VkMappedMemoryRange *)VmaMalloc((this->m_Allocator).m_pCallbacks,uVar1 * 0x28,8);
      memcpy(__dest,this->m_pArray,this->m_Count * 0x28);
    }
    pVVar2 = (this->m_Allocator).m_pCallbacks;
    if ((pVVar2 == (VkAllocationCallbacks *)0x0) || (pVVar2->pfnFree == (PFN_vkFreeFunction)0x0)) {
      free(this->m_pArray);
    }
    else {
      (*pVVar2->pfnFree)(pVVar2->pUserData,this->m_pArray);
    }
    this->m_Capacity = this->m_Count;
    this->m_pArray = __dest;
  }
  return;
}

Assistant:

void VmaVector<T, AllocatorT>::shrink_to_fit()
{
    if (m_Capacity > m_Count)
    {
        T* newArray = VMA_NULL;
        if (m_Count > 0)
        {
            newArray = VmaAllocateArray<T>(m_Allocator.m_pCallbacks, m_Count);
            memcpy(newArray, m_pArray, m_Count * sizeof(T));
        }
        VmaFree(m_Allocator.m_pCallbacks, m_pArray);
        m_Capacity = m_Count;
        m_pArray = newArray;
    }
}